

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26dba::TestNotifiesReporterOfTestEnd::~TestNotifiesReporterOfTestEnd
          (TestNotifiesReporterOfTestEnd *this)

{
  TestNotifiesReporterOfTestEnd *this_local;
  
  ~TestNotifiesReporterOfTestEnd(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(NotifiesReporterOfTestEnd)
{
    RecordingReporter reporter;
    TestResults results(&reporter);

    results.OnTestFinish(details, 0.1234f);
    CHECK_EQUAL (1, reporter.testFinishedCount);
    CHECK_EQUAL ("testname", reporter.lastFinishedTest);
    CHECK_EQUAL ("suitename", reporter.lastFinishedSuite);
    CHECK_CLOSE (0.1234f, reporter.lastFinishedTestTime, 0.0001f);
}